

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2c.cc
# Opt level: O3

int ProgramMain(int argc,char **argv)

{
  long *plVar1;
  pointer pcVar2;
  Errors *errors_00;
  string *header;
  long lVar3;
  pointer pcVar4;
  Result RVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  char *pcVar7;
  char **unaff_RBX;
  ulong unaff_RBP;
  char **ppcVar8;
  OptionParser *pOVar9;
  OptionParser *this;
  ulong unaff_R12;
  undefined8 unaff_R13;
  Callback *unaff_R14;
  OptionParser *unaff_R15;
  Errors errors;
  size_type __dnew;
  OptionParser parser;
  
  pOVar9 = (OptionParser *)(ulong)(uint)argc;
  while( true ) {
    *(ulong *)((long)register0x00000020 + -8) = unaff_RBP;
    *(OptionParser **)((long)register0x00000020 + -0x10) = unaff_R15;
    *(Callback **)((long)register0x00000020 + -0x18) = unaff_R14;
    *(undefined8 *)((long)register0x00000020 + -0x20) = unaff_R13;
    *(ulong *)((long)register0x00000020 + -0x28) = unaff_R12;
    *(char ***)((long)register0x00000020 + -0x30) = unaff_RBX;
    *(undefined8 *)((long)register0x00000020 + -0x120) = 0x114d45;
    wabt::InitStdio();
    *(undefined8 *)((long)register0x00000020 + -0x120) = 0x114d60;
    wabt::OptionParser::OptionParser
              ((OptionParser *)((long)register0x00000020 + -0xc0),"wasm2c",
               "  Read a file in the WebAssembly binary format, and convert it to\n  a C source file and header.\n\nexamples:\n  # parse binary file test.wasm and write test.c and test.h\n  $ wasm2c test.wasm -o test.c\n\n  # parse test.wasm, write test.c and test.h, but ignore the debug names, if any\n  $ wasm2c test.wasm --no-debug-names -o test.c\n"
              );
    *(undefined8 *)
     &(((NullCallback *)((long)register0x00000020 + -0x108))->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)register0x00000020 + -0x100) = 0;
    *(code **)((long)register0x00000020 + -0xf0) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2c.cc:76:72)>
         ::_M_invoke;
    *(code **)((long)register0x00000020 + -0xf8) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2c.cc:76:72)>
         ::_M_manager;
    *(undefined8 *)((long)register0x00000020 + -0x120) = 0x114da0;
    wabt::OptionParser::AddOption
              ((OptionParser *)((long)register0x00000020 + -0xc0),'v',"verbose",
               "Use multiple times for more info",
               (NullCallback *)((long)register0x00000020 + -0x108));
    if (*(code **)((long)register0x00000020 + -0xf8) != (code *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x120) = 0x114db8;
      (**(code **)((long)register0x00000020 + -0xf8))
                ((undefined1 *)((long)register0x00000020 + -0x108),
                 (undefined1 *)((long)register0x00000020 + -0x108),3);
    }
    *(undefined8 *)
     &(((Callback *)((long)register0x00000020 + -0x108))->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)register0x00000020 + -0x100) = 0;
    *(code **)((long)register0x00000020 + -0xf0) =
         std::
         _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2c.cc:83:7)>
         ::_M_invoke;
    *(code **)((long)register0x00000020 + -0xf8) =
         std::
         _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2c.cc:83:7)>
         ::_M_manager;
    *(undefined8 *)((long)register0x00000020 + -0x120) = 0x114e01;
    wabt::OptionParser::AddOption
              ((OptionParser *)((long)register0x00000020 + -0xc0),'o',"output","FILENAME",
               "Output file for the generated C source file, by default use stdout",
               (Callback *)((long)register0x00000020 + -0x108));
    if (*(code **)((long)register0x00000020 + -0xf8) != (code *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x120) = 0x114e19;
      (**(code **)((long)register0x00000020 + -0xf8))
                ((undefined1 *)((long)register0x00000020 + -0x108),
                 (undefined1 *)((long)register0x00000020 + -0x108),3);
    }
    *(undefined8 *)
     &(((Callback *)((long)register0x00000020 + -0x108))->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)register0x00000020 + -0x100) = 0;
    *(code **)((long)register0x00000020 + -0xf0) =
         std::
         _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2c.cc:89:7)>
         ::_M_invoke;
    *(code **)((long)register0x00000020 + -0xf8) =
         std::
         _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2c.cc:89:7)>
         ::_M_manager;
    *(undefined8 *)((long)register0x00000020 + -0x120) = 0x114e5f;
    wabt::OptionParser::AddOption
              ((OptionParser *)((long)register0x00000020 + -0xc0),'\0',"num-outputs","NUM",
               "Number of output files to write",(Callback *)((long)register0x00000020 + -0x108));
    if (*(code **)((long)register0x00000020 + -0xf8) != (code *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x120) = 0x114e77;
      (**(code **)((long)register0x00000020 + -0xf8))
                ((undefined1 *)((long)register0x00000020 + -0x108),
                 (undefined1 *)((long)register0x00000020 + -0x108),3);
    }
    *(undefined8 *)
     &(((Callback *)((long)register0x00000020 + -0x108))->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)register0x00000020 + -0x100) = 0;
    *(code **)((long)register0x00000020 + -0xf0) =
         std::
         _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2c.cc:96:7)>
         ::_M_invoke;
    *(code **)((long)register0x00000020 + -0xf8) =
         std::
         _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2c.cc:96:7)>
         ::_M_manager;
    *(undefined8 *)((long)register0x00000020 + -0x120) = 0x114ec0;
    wabt::OptionParser::AddOption
              ((OptionParser *)((long)register0x00000020 + -0xc0),'n',"module-name","MODNAME",
               "Unique name for the module being generated. This name is prefixed to\neach of the generaed C symbols. By default, the module name from the\nnames section is used. If that is not present the name of the input\nfile is used as the default.\n"
               ,(Callback *)((long)register0x00000020 + -0x108));
    if (*(code **)((long)register0x00000020 + -0xf8) != (code *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x120) = 0x114ed8;
      (**(code **)((long)register0x00000020 + -0xf8))
                ((undefined1 *)((long)register0x00000020 + -0x108),
                 (undefined1 *)((long)register0x00000020 + -0x108),3);
    }
    *(undefined8 *)((long)register0x00000020 + -0x120) = 0x114eec;
    wabt::Features::AddOptions
              (&s_write_c_options.features,(OptionParser *)((long)register0x00000020 + -0xc0));
    *(undefined8 *)
     &(((NullCallback *)((long)register0x00000020 + -0x108))->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)register0x00000020 + -0x100) = 0;
    *(code **)((long)register0x00000020 + -0xf0) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2c.cc:99:20)>
         ::_M_invoke;
    *(code **)((long)register0x00000020 + -0xf8) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2c.cc:99:20)>
         ::_M_manager;
    *(undefined8 *)((long)register0x00000020 + -0x120) = 0x114f27;
    wabt::OptionParser::AddOption
              ((OptionParser *)((long)register0x00000020 + -0xc0),"no-debug-names",
               "Ignore debug names in the binary file",
               (NullCallback *)((long)register0x00000020 + -0x108));
    if (*(code **)((long)register0x00000020 + -0xf8) != (code *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x120) = 0x114f3f;
      (**(code **)((long)register0x00000020 + -0xf8))
                ((undefined1 *)((long)register0x00000020 + -0x108),
                 (undefined1 *)((long)register0x00000020 + -0x108),3);
    }
    unaff_R15 = (OptionParser *)((long)register0x00000020 + -0xf8);
    *(OptionParser **)((long)register0x00000020 + -0x108) = unaff_R15;
    (unaff_R15->program_name_)._M_dataplus._M_p = (pointer)0x656d616e656c6966;
    *(undefined8 *)((long)register0x00000020 + -0x100) = 8;
    *(undefined1 *)((long)register0x00000020 + -0xf0) = 0;
    unaff_R14 = (Callback *)((long)register0x00000020 + -0xe8);
    *(undefined8 *)&(unaff_R14->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)register0x00000020 + -0xe0) = 0;
    *(code **)((long)register0x00000020 + -0xd0) =
         std::
         _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2c.cc:101:22)>
         ::_M_invoke;
    *(code **)((long)register0x00000020 + -0xd8) =
         std::
         _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2c.cc:101:22)>
         ::_M_manager;
    *(undefined8 *)((long)register0x00000020 + -0x120) = 0x114f98;
    wabt::OptionParser::AddArgument
              ((OptionParser *)((long)register0x00000020 + -0xc0),
               (string *)((long)register0x00000020 + -0x108),One,unaff_R14);
    if (*(code **)((long)register0x00000020 + -0xd8) != (code *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x120) = 0x114fb0;
      (**(code **)((long)register0x00000020 + -0xd8))
                ((undefined1 *)((long)register0x00000020 + -0xe8),
                 (undefined1 *)((long)register0x00000020 + -0xe8),3);
    }
    if (*(OptionParser **)((long)register0x00000020 + -0x108) != unaff_R15) {
      *(undefined8 *)((long)register0x00000020 + -0x120) = 0x114fc7;
      operator_delete(*(OptionParser **)((long)register0x00000020 + -0x108),
                      *(long *)((long)register0x00000020 + -0xf8) + 1);
    }
    this = (OptionParser *)((long)register0x00000020 + -0xc0);
    ppcVar8 = (char **)((ulong)pOVar9 & 0xffffffff);
    *(undefined8 *)((long)register0x00000020 + -0x120) = 0x114fd6;
    wabt::OptionParser::Parse(this,(int)pOVar9,argv);
    unaff_RBP = 0;
    unaff_RBX = argv;
    argv = ppcVar8;
    pOVar9 = this;
    if (s_write_c_options.features.exceptions_enabled_ == true) {
      unaff_RBX = (char **)((long)register0x00000020 + -0x108);
      *unaff_RBX = (char *)unaff_R15;
      *(undefined8 *)((long)register0x00000020 + -0xf8) = 0x6f69747065637865;
      *(undefined2 *)((long)register0x00000020 + -0xf0) = 0x736e;
      *(undefined8 *)((long)register0x00000020 + -0x100) = 10;
      *(undefined1 *)((long)register0x00000020 + -0xee) = 0;
      argv = (char **)&s_read_debug_names;
      *(undefined8 *)((long)register0x00000020 + -0x120) = 0x115022;
      pbVar6 = std::
               __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                         (supported_features_abi_cxx11_,&s_read_debug_names,unaff_RBX);
      unaff_R14 = (Callback *)
                  CONCAT71(0x22e9,pbVar6 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&s_read_debug_names);
      pOVar9 = (OptionParser *)*unaff_RBX;
      if (pOVar9 != unaff_R15) {
        argv = (char **)(*(long *)((long)register0x00000020 + -0xf8) + 1);
        *(undefined8 *)((long)register0x00000020 + -0x120) = 0x115040;
        operator_delete(pOVar9,(ulong)argv);
      }
      unaff_RBP = (ulong)(pbVar6 ==
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &s_read_debug_names);
    }
    if (s_write_c_options.features.threads_enabled_ == true) {
      unaff_RBX = (char **)((long)register0x00000020 + -0x108);
      *unaff_RBX = (char *)unaff_R15;
      *(undefined4 *)((long)register0x00000020 + -0xf8) = 0x65726874;
      *(undefined4 *)((long)register0x00000020 + -0xf5) = 0x73646165;
      *(undefined8 *)((long)register0x00000020 + -0x100) = 7;
      *(undefined1 *)((long)register0x00000020 + -0xf1) = 0;
      unaff_R14 = (Callback *)&s_read_debug_names;
      argv = (char **)&s_read_debug_names;
      *(undefined8 *)((long)register0x00000020 + -0x120) = 0x115087;
      pbVar6 = std::
               __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                         (supported_features_abi_cxx11_,&s_read_debug_names,unaff_RBX);
      unaff_R12 = (ulong)(pbVar6 ==
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &s_read_debug_names);
      pOVar9 = (OptionParser *)*unaff_RBX;
      if (pOVar9 != unaff_R15) {
        argv = (char **)(*(long *)((long)register0x00000020 + -0xf8) + 1);
        *(undefined8 *)((long)register0x00000020 + -0x120) = 0x1150a6;
        operator_delete(pOVar9,(ulong)argv);
      }
      unaff_RBP = (ulong)((uint)unaff_RBP |
                         (uint)(pbVar6 ==
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &s_read_debug_names));
    }
    if (s_write_c_options.features.function_references_enabled_ == true) {
      unaff_RBX = (char **)((long)register0x00000020 + -0x108);
      *unaff_RBX = (char *)unaff_R15;
      plVar1 = (long *)((long)register0x00000020 + -0xe8);
      *plVar1 = 0x13;
      *(undefined8 *)((long)register0x00000020 + -0x120) = 0x1150d3;
      pcVar7 = (char *)std::__cxx11::string::_M_create((ulong *)unaff_RBX,(ulong)plVar1);
      *unaff_RBX = pcVar7;
      lVar3 = *plVar1;
      *(long *)((long)register0x00000020 + -0xf8) = lVar3;
      builtin_strncpy(pcVar7,"function-references",0x13);
      *(long *)((long)register0x00000020 + -0x100) = lVar3;
      (*unaff_RBX)[lVar3] = '\0';
      argv = (char **)&s_read_debug_names;
      *(undefined8 *)((long)register0x00000020 + -0x120) = 0x115112;
      pbVar6 = std::
               __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                         (supported_features_abi_cxx11_,&s_read_debug_names,unaff_RBX);
      unaff_R14 = (Callback *)
                  CONCAT71(0x22e9,pbVar6 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&s_read_debug_names);
      pOVar9 = (OptionParser *)*unaff_RBX;
      if (pOVar9 != unaff_R15) {
        argv = (char **)(*(long *)((long)register0x00000020 + -0xf8) + 1);
        *(undefined8 *)((long)register0x00000020 + -0x120) = 0x11512e;
        operator_delete(pOVar9,(ulong)argv);
      }
      unaff_RBP = (ulong)(byte)((byte)unaff_RBP |
                               pbVar6 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&s_read_debug_names);
    }
    if (s_write_c_options.features.tail_call_enabled_ == true) {
      unaff_RBX = (char **)((long)register0x00000020 + -0x108);
      *unaff_RBX = (char *)unaff_R15;
      *(undefined8 *)((long)register0x00000020 + -0xf8) = 0x6c61632d6c696174;
      *(undefined2 *)((long)register0x00000020 + -0xf0) = 0x6c;
      *(undefined8 *)((long)register0x00000020 + -0x100) = 9;
      argv = (char **)&s_read_debug_names;
      *(undefined8 *)((long)register0x00000020 + -0x120) = 0x115177;
      pbVar6 = std::
               __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                         (supported_features_abi_cxx11_,&s_read_debug_names,unaff_RBX);
      unaff_R14 = (Callback *)
                  CONCAT71(0x22e9,pbVar6 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&s_read_debug_names);
      pOVar9 = (OptionParser *)*unaff_RBX;
      if (pOVar9 != unaff_R15) {
        argv = (char **)(*(long *)((long)register0x00000020 + -0xf8) + 1);
        *(undefined8 *)((long)register0x00000020 + -0x120) = 0x115193;
        operator_delete(pOVar9,(ulong)argv);
      }
      unaff_RBP = (ulong)(byte)((byte)unaff_RBP |
                               pbVar6 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&s_read_debug_names);
    }
    if (s_write_c_options.features.annotations_enabled_ == true) {
      unaff_RBX = (char **)((long)register0x00000020 + -0x108);
      *unaff_RBX = (char *)unaff_R15;
      *(undefined8 *)((long)register0x00000020 + -0xf8) = 0x697461746f6e6e61;
      *(undefined4 *)((long)register0x00000020 + -0xf1) = 0x736e6f69;
      *(undefined8 *)((long)register0x00000020 + -0x100) = 0xb;
      *(undefined1 *)((long)register0x00000020 + -0xed) = 0;
      argv = (char **)&s_read_debug_names;
      *(undefined8 *)((long)register0x00000020 + -0x120) = 0x1151e1;
      pbVar6 = std::
               __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                         (supported_features_abi_cxx11_,&s_read_debug_names,unaff_RBX);
      unaff_R14 = (Callback *)
                  CONCAT71(0x22e9,pbVar6 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&s_read_debug_names);
      pOVar9 = (OptionParser *)*unaff_RBX;
      if (pOVar9 != unaff_R15) {
        argv = (char **)(*(long *)((long)register0x00000020 + -0xf8) + 1);
        *(undefined8 *)((long)register0x00000020 + -0x120) = 0x1151fd;
        operator_delete(pOVar9,(ulong)argv);
      }
      unaff_RBP = (ulong)(byte)((byte)unaff_RBP |
                               pbVar6 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&s_read_debug_names);
    }
    if (s_write_c_options.features.code_metadata_enabled_ == true) {
      unaff_RBX = (char **)((long)register0x00000020 + -0x108);
      *unaff_RBX = (char *)unaff_R15;
      *(undefined8 *)((long)register0x00000020 + -0xf8) = 0x74656d2d65646f63;
      *(undefined8 *)((long)register0x00000020 + -0xf3) = 0x617461646174656d;
      *(undefined8 *)((long)register0x00000020 + -0x100) = 0xd;
      *(undefined1 *)((long)register0x00000020 + -0xeb) = 0;
      argv = (char **)&s_read_debug_names;
      *(undefined8 *)((long)register0x00000020 + -0x120) = 0x115252;
      pbVar6 = std::
               __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                         (supported_features_abi_cxx11_,&s_read_debug_names,unaff_RBX);
      unaff_R14 = (Callback *)
                  CONCAT71(0x22e9,pbVar6 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&s_read_debug_names);
      pOVar9 = (OptionParser *)*unaff_RBX;
      if (pOVar9 != unaff_R15) {
        argv = (char **)(*(long *)((long)register0x00000020 + -0xf8) + 1);
        *(undefined8 *)((long)register0x00000020 + -0x120) = 0x11526e;
        operator_delete(pOVar9,(ulong)argv);
      }
      unaff_RBP = (ulong)(byte)((byte)unaff_RBP |
                               pbVar6 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&s_read_debug_names);
    }
    if (s_write_c_options.features.gc_enabled_ == true) {
      unaff_RBX = (char **)((long)register0x00000020 + -0x108);
      *unaff_RBX = (char *)unaff_R15;
      *(undefined2 *)((long)register0x00000020 + -0xf8) = 0x6367;
      *(undefined8 *)((long)register0x00000020 + -0x100) = 2;
      *(undefined1 *)((long)register0x00000020 + -0xf6) = 0;
      argv = (char **)&s_read_debug_names;
      *(undefined8 *)((long)register0x00000020 + -0x120) = 0x1152ad;
      pbVar6 = std::
               __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                         (supported_features_abi_cxx11_,&s_read_debug_names,unaff_RBX);
      unaff_R14 = (Callback *)
                  CONCAT71(0x22e9,pbVar6 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&s_read_debug_names);
      pOVar9 = (OptionParser *)*unaff_RBX;
      if (pOVar9 != unaff_R15) {
        argv = (char **)(*(long *)((long)register0x00000020 + -0xf8) + 1);
        *(undefined8 *)((long)register0x00000020 + -0x120) = 0x1152c9;
        operator_delete(pOVar9,(ulong)argv);
      }
      unaff_RBP = (ulong)(byte)((byte)unaff_RBP |
                               pbVar6 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&s_read_debug_names);
    }
    if (s_write_c_options.features.memory64_enabled_ == true) {
      unaff_RBX = (char **)((long)register0x00000020 + -0x108);
      *unaff_RBX = (char *)unaff_R15;
      *(undefined8 *)((long)register0x00000020 + -0xf8) = 0x343679726f6d656d;
      *(undefined8 *)((long)register0x00000020 + -0x100) = 8;
      *(undefined1 *)((long)register0x00000020 + -0xf0) = 0;
      argv = (char **)&s_read_debug_names;
      *(undefined8 *)((long)register0x00000020 + -0x120) = 0x115310;
      pbVar6 = std::
               __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                         (supported_features_abi_cxx11_,&s_read_debug_names,unaff_RBX);
      unaff_R14 = (Callback *)
                  CONCAT71(0x22e9,pbVar6 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&s_read_debug_names);
      pOVar9 = (OptionParser *)*unaff_RBX;
      if (pOVar9 != unaff_R15) {
        argv = (char **)(*(long *)((long)register0x00000020 + -0xf8) + 1);
        *(undefined8 *)((long)register0x00000020 + -0x120) = 0x11532c;
        operator_delete(pOVar9,(ulong)argv);
      }
      unaff_RBP = (ulong)(byte)((byte)unaff_RBP |
                               pbVar6 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&s_read_debug_names);
    }
    if (s_write_c_options.features.multi_memory_enabled_ == true) {
      unaff_RBX = (char **)((long)register0x00000020 + -0x108);
      *unaff_RBX = (char *)unaff_R15;
      *(undefined8 *)((long)register0x00000020 + -0xf8) = 0x656d2d69746c756d;
      *(undefined4 *)((long)register0x00000020 + -0xf0) = 0x79726f6d;
      *(undefined8 *)((long)register0x00000020 + -0x100) = 0xc;
      *(undefined1 *)((long)register0x00000020 + -0xec) = 0;
      argv = (char **)&s_read_debug_names;
      *(undefined8 *)((long)register0x00000020 + -0x120) = 0x11537a;
      pbVar6 = std::
               __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                         (supported_features_abi_cxx11_,&s_read_debug_names,unaff_RBX);
      unaff_R14 = (Callback *)
                  CONCAT71(0x22e9,pbVar6 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&s_read_debug_names);
      pOVar9 = (OptionParser *)*unaff_RBX;
      if (pOVar9 != unaff_R15) {
        argv = (char **)(*(long *)((long)register0x00000020 + -0xf8) + 1);
        *(undefined8 *)((long)register0x00000020 + -0x120) = 0x115396;
        operator_delete(pOVar9,(ulong)argv);
      }
      unaff_RBP = (ulong)(byte)((byte)unaff_RBP |
                               pbVar6 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&s_read_debug_names);
    }
    if (s_write_c_options.features.extended_const_enabled_ == true) {
      unaff_RBX = (char **)((long)register0x00000020 + -0x108);
      *unaff_RBX = (char *)unaff_R15;
      *(undefined8 *)((long)register0x00000020 + -0xf8) = 0x6465646e65747865;
      *(undefined8 *)((long)register0x00000020 + -0xf2) = 0x74736e6f632d6465;
      *(undefined8 *)((long)register0x00000020 + -0x100) = 0xe;
      *(undefined1 *)((long)register0x00000020 + -0xea) = 0;
      argv = (char **)&s_read_debug_names;
      *(undefined8 *)((long)register0x00000020 + -0x120) = 0x1153eb;
      pbVar6 = std::
               __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                         (supported_features_abi_cxx11_,&s_read_debug_names,unaff_RBX);
      unaff_R14 = (Callback *)
                  CONCAT71(0x22e9,pbVar6 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&s_read_debug_names);
      pOVar9 = (OptionParser *)*unaff_RBX;
      if (pOVar9 != unaff_R15) {
        argv = (char **)(*(long *)((long)register0x00000020 + -0xf8) + 1);
        *(undefined8 *)((long)register0x00000020 + -0x120) = 0x115407;
        operator_delete(pOVar9,(ulong)argv);
      }
      unaff_RBP = (ulong)(byte)((byte)unaff_RBP |
                               pbVar6 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&s_read_debug_names);
    }
    if (s_write_c_options.features.relaxed_simd_enabled_ == true) {
      unaff_RBX = (char **)((long)register0x00000020 + -0x108);
      *unaff_RBX = (char *)unaff_R15;
      *(undefined8 *)((long)register0x00000020 + -0xf8) = 0x2d646578616c6572;
      *(undefined4 *)((long)register0x00000020 + -0xf0) = 0x646d6973;
      *(undefined8 *)((long)register0x00000020 + -0x100) = 0xc;
      *(undefined1 *)((long)register0x00000020 + -0xec) = 0;
      argv = (char **)&s_read_debug_names;
      *(undefined8 *)((long)register0x00000020 + -0x120) = 0x115455;
      pbVar6 = std::
               __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                         (supported_features_abi_cxx11_,&s_read_debug_names,unaff_RBX);
      unaff_R14 = (Callback *)
                  CONCAT71(0x22e9,pbVar6 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&s_read_debug_names);
      pOVar9 = (OptionParser *)*unaff_RBX;
      if (pOVar9 != unaff_R15) {
        argv = (char **)(*(long *)((long)register0x00000020 + -0xf8) + 1);
        *(undefined8 *)((long)register0x00000020 + -0x120) = 0x115471;
        operator_delete(pOVar9,(ulong)argv);
      }
      unaff_RBP = (ulong)(byte)((byte)unaff_RBP |
                               pbVar6 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&s_read_debug_names);
    }
    if (s_write_c_options.features.custom_page_sizes_enabled_ != false) {
      unaff_RBX = (char **)((long)register0x00000020 + -0x108);
      *unaff_RBX = (char *)unaff_R15;
      plVar1 = (long *)((long)register0x00000020 + -0xe8);
      *plVar1 = 0x11;
      *(undefined8 *)((long)register0x00000020 + -0x120) = 0x11549e;
      pcVar7 = (char *)std::__cxx11::string::_M_create((ulong *)unaff_RBX,(ulong)plVar1);
      *unaff_RBX = pcVar7;
      lVar3 = *plVar1;
      *(long *)((long)register0x00000020 + -0xf8) = lVar3;
      builtin_strncpy(pcVar7,"custom-page-sizes",0x11);
      *(long *)((long)register0x00000020 + -0x100) = lVar3;
      (*unaff_RBX)[lVar3] = '\0';
      unaff_R14 = (Callback *)&s_read_debug_names;
      argv = (char **)&s_read_debug_names;
      *(undefined8 *)((long)register0x00000020 + -0x120) = 0x1154da;
      pbVar6 = std::
               __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                         (supported_features_abi_cxx11_,&s_read_debug_names,unaff_RBX);
      unaff_RBP = (ulong)(byte)((byte)unaff_RBP |
                               pbVar6 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&s_read_debug_names);
      pOVar9 = (OptionParser *)*unaff_RBX;
      if (pOVar9 != unaff_R15) {
        argv = (char **)(*(long *)((long)register0x00000020 + -0xf8) + 1);
        *(undefined8 *)((long)register0x00000020 + -0x120) = 0x1154f8;
        operator_delete(pOVar9,(ulong)argv);
      }
    }
    if ((char)unaff_RBP == '\0') break;
    *(code **)((long)register0x00000020 + -0x120) = main;
    ProgramMain();
    register0x00000020 = (BADSPACEBASE *)((long)register0x00000020 + -0x118);
  }
  if (*(code **)((long)register0x00000020 + -0x40) != (code *)0x0) {
    *(undefined8 *)((long)register0x00000020 + -0x120) = 0x115520;
    (**(code **)((long)register0x00000020 + -0x40))
              ((undefined1 *)((long)register0x00000020 + -0x50),
               (undefined1 *)((long)register0x00000020 + -0x50),3);
  }
  *(undefined8 *)((long)register0x00000020 + -0x120) = 0x11552d;
  std::vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>::~vector
            ((vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_> *)
             ((long)register0x00000020 + -0x68));
  *(undefined8 *)((long)register0x00000020 + -0x120) = 0x11553d;
  std::vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>::~vector
            ((vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_> *)
             ((long)register0x00000020 + -0x80));
  if (*(undefined1 **)((long)register0x00000020 + -0xa0) !=
      (undefined1 *)((long)register0x00000020 + -0x90)) {
    *(undefined8 *)((long)register0x00000020 + -0x120) = 0x11555e;
    operator_delete(*(undefined1 **)((long)register0x00000020 + -0xa0),
                    *(long *)((long)register0x00000020 + -0x90) + 1);
  }
  pcVar2 = (pointer)((long)register0x00000020 + -0xb0);
  if (*(pointer *)((long)register0x00000020 + -0xc0) != pcVar2) {
    *(undefined8 *)((long)register0x00000020 + -0x120) = 0x11557a;
    operator_delete(*(pointer *)((long)register0x00000020 + -0xc0),
                    *(long *)((long)register0x00000020 + -0xb0) + 1);
  }
  errors_00 = (Errors *)((long)register0x00000020 + -0x108);
  *(undefined8 *)((long)register0x00000020 + -0xf8) = 0;
  (errors_00->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined8 *)((long)register0x00000020 + -0x100) = 0;
  *(undefined8 *)((long)register0x00000020 + -0x120) = 0x115595;
  RVar5 = Wasm2cMain(errors_00);
  header = (string *)((long)register0x00000020 + -0xc0);
  (header->_M_dataplus)._M_p = pcVar2;
  *(undefined8 *)((long)register0x00000020 + -0xb8) = 0;
  *(undefined1 *)((long)register0x00000020 + -0xb0) = 0;
  *(undefined4 *)((long)register0x00000020 + -0x118) = 0x50;
  *(undefined8 *)((long)register0x00000020 + -0x120) = 0x1155ce;
  wabt::FormatErrorsToFile
            (errors_00,Binary,(LexerSourceLineFinder *)0x0,_stderr,header,Never,
             *(int *)((long)register0x00000020 + -0x118));
  pcVar4 = (header->_M_dataplus)._M_p;
  if (pcVar4 != pcVar2) {
    *(undefined8 *)((long)register0x00000020 + -0x120) = 0x1155e3;
    operator_delete(pcVar4,*(long *)((long)register0x00000020 + -0xb0) + 1);
  }
  *(undefined8 *)((long)register0x00000020 + -0x120) = 0x1155f5;
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
            ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)
             ((long)register0x00000020 + -0x108));
  return (int)(RVar5.enum_ != Ok);
}

Assistant:

int ProgramMain(int argc, char** argv) {
  Result result;

  InitStdio();
  ParseOptions(argc, argv);

  Errors errors;
  result = Wasm2cMain(errors);
  FormatErrorsToFile(errors, Location::Type::Binary);

  return result != Result::Ok;
}